

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseComprehensionSpecs
          (Token *__return_storage_ptr__,Parser *this,Kind end,Fodder *for_fodder,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  ostream *o;
  Kind KVar1;
  Allocator *this_00;
  long *plVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  Fodder *__x;
  Location *pLVar6;
  Identifier *pIVar7;
  StaticError *this_01;
  Token *tok;
  AST *cond;
  AST *arr;
  Identifier *id;
  LocationRange l;
  Token tok_1;
  Token in_token;
  Token id_token;
  Kind local_44c;
  string local_448;
  Fodder *local_420;
  vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
  *local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e8;
  Fodder *local_3e0;
  Location *local_3d8;
  unsigned_long *local_3d0;
  string *local_3c8;
  string *local_3c0;
  string *local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b0;
  string *local_3a8;
  string *local_3a0;
  void *local_398;
  AST *local_390;
  AST *local_388;
  Identifier *local_380;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 local_368;
  undefined7 uStack_367;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_328;
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  unsigned_long local_298 [29];
  Token local_1b0;
  Token local_f0;
  
  local_3a8 = (string *)&__return_storage_ptr__->location;
  local_3a0 = (string *)&local_2b8;
  local_3d8 = &(__return_storage_ptr__->location).begin;
  local_3d0 = local_298;
  local_3b0 = &local_2a8;
  local_3f8 = &(__return_storage_ptr__->location).file.field_2;
  local_3f0 = &local_1b0.location.file.field_2;
  local_3e8 = &local_f0.location.file.field_2;
  local_3e0 = &__return_storage_ptr__->fodder;
  local_3b8 = (string *)&__return_storage_ptr__->data;
  local_3c0 = (string *)&__return_storage_ptr__->stringBlockIndent;
  local_3c8 = (string *)&__return_storage_ptr__->stringBlockTermIndent;
  local_400 = &(__return_storage_ptr__->stringBlockTermIndent).field_2;
  local_408 = &(__return_storage_ptr__->stringBlockIndent).field_2;
  local_410 = &(__return_storage_ptr__->data).field_2;
  local_420 = for_fodder;
  local_418 = (vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
               *)specs;
  do {
    local_378 = &local_368;
    local_370 = 0;
    local_368 = 0;
    local_348 = 0;
    uStack_340 = 0;
    local_358 = 0;
    uStack_350 = 0;
    popExpect(&local_f0,this,IDENTIFIER,(char *)0x0);
    this_00 = this->alloc;
    Token::data32_abi_cxx11_((UString *)local_338,&local_f0);
    pIVar7 = Allocator::makeIdentifier(this_00,(UString *)local_338);
    pLVar6 = local_3d8;
    __x = local_3e0;
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,local_328._M_allocated_capacity * 4 + 4);
    }
    local_380 = pIVar7;
    popExpect(&local_1b0,this,IN,(char *)0x0);
    local_388 = parse(this,0xf);
    local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
    std::
    vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
    ::
    emplace_back<jsonnet::internal::ComprehensionSpec::Kind,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
              (local_418,(Kind *)local_338,local_420,&local_f0.fodder,&local_380,&local_1b0.fodder,
               &local_388);
    Token::Token(__return_storage_ptr__,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    while (KVar1 = __return_storage_ptr__->kind, KVar1 == IF) {
      local_390 = parse(this,0xf);
      local_44c = IF;
      local_328._M_allocated_capacity = 0;
      local_338._0_8_ = (pointer)0x0;
      local_338._8_8_ = (pointer)0x0;
      local_398 = (void *)0x0;
      local_448.field_2._M_allocated_capacity = 0;
      local_448._M_dataplus._M_p = (pointer)0x0;
      local_448._M_string_length = 0;
      std::
      vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
      ::
      emplace_back<jsonnet::internal::ComprehensionSpec::Kind,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::AST*&>
                (local_418,&local_44c,__x,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)local_338,&local_398,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&local_448,&local_390);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&local_448);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_338);
      Token::Token((Token *)local_338,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      __return_storage_ptr__->kind = local_338._0_4_;
      local_448._M_dataplus._M_p =
           (pointer)(__return_storage_ptr__->fodder).
                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_448._M_string_length =
           (size_type)
           (__return_storage_ptr__->fodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_448.field_2._M_allocated_capacity =
           (size_type)
           (__return_storage_ptr__->fodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->fodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_338._8_8_;
      (__return_storage_ptr__->fodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_328._M_allocated_capacity;
      (__return_storage_ptr__->fodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_328._8_8_;
      local_338._8_8_ = (pointer)0x0;
      local_328._M_allocated_capacity = 0;
      local_328._8_8_ = (pointer)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&local_448);
      std::__cxx11::string::operator=(local_3b8,(string *)&local_318);
      std::__cxx11::string::operator=(local_3c0,(string *)&local_2f8);
      std::__cxx11::string::operator=(local_3c8,(string *)&local_2d8);
      std::__cxx11::string::operator=(local_3a8,local_3a0);
      uVar3 = *local_3d0;
      uVar4 = local_3d0[1];
      uVar5 = local_3d0[3];
      pLVar6[1].line = local_3d0[2];
      pLVar6[1].column = uVar5;
      pLVar6->line = uVar3;
      pLVar6->column = uVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_p != local_3b0) {
        operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_p != &local_2c8) {
        operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_p != &local_2e8) {
        operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != &local_308) {
        operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)(local_338 + 8));
    }
    if (KVar1 != end) {
      if (KVar1 != FOR) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_338);
        o = (ostream *)(local_338 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(o,"expected for, if or ",0x14);
        operator<<(o,end);
        std::__ostream_insert<char,std::char_traits<char>>(o," after for clause, got: ",0x18);
        operator<<(o,__return_storage_ptr__);
        this_01 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(this_01,&__return_storage_ptr__->location,&local_448);
        __cxa_throw(this_01,&StaticError::typeinfo,StaticError::~StaticError);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(local_420,__x);
      plVar2 = (long *)(__return_storage_ptr__->location).file._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2 != local_3f8) {
        operator_delete(plVar2,local_3f8->_M_allocated_capacity + 1);
      }
      plVar2 = (long *)(__return_storage_ptr__->stringBlockTermIndent)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2 != local_400) {
        operator_delete(plVar2,local_400->_M_allocated_capacity + 1);
      }
      plVar2 = (long *)(__return_storage_ptr__->stringBlockIndent)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2 != local_408) {
        operator_delete(plVar2,local_408->_M_allocated_capacity + 1);
      }
      plVar2 = (long *)(__return_storage_ptr__->data)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2 != local_410) {
        operator_delete(plVar2,local_410->_M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(__x);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.location.file._M_dataplus._M_p != local_3f0) {
      operator_delete(local_1b0.location.file._M_dataplus._M_p,
                      local_1b0.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.stringBlockTermIndent._M_dataplus._M_p !=
        &local_1b0.stringBlockTermIndent.field_2) {
      operator_delete(local_1b0.stringBlockTermIndent._M_dataplus._M_p,
                      local_1b0.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.stringBlockIndent._M_dataplus._M_p != &local_1b0.stringBlockIndent.field_2) {
      operator_delete(local_1b0.stringBlockIndent._M_dataplus._M_p,
                      local_1b0.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.data._M_dataplus._M_p != &local_1b0.data.field_2) {
      operator_delete(local_1b0.data._M_dataplus._M_p,
                      local_1b0.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_1b0.fodder);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.location.file._M_dataplus._M_p != local_3e8) {
      operator_delete(local_f0.location.file._M_dataplus._M_p,
                      local_f0.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.stringBlockTermIndent._M_dataplus._M_p !=
        &local_f0.stringBlockTermIndent.field_2) {
      operator_delete(local_f0.stringBlockTermIndent._M_dataplus._M_p,
                      local_f0.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.stringBlockIndent._M_dataplus._M_p != &local_f0.stringBlockIndent.field_2) {
      operator_delete(local_f0.stringBlockIndent._M_dataplus._M_p,
                      local_f0.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.data._M_dataplus._M_p != &local_f0.data.field_2) {
      operator_delete(local_f0.data._M_dataplus._M_p,local_f0.data.field_2._M_allocated_capacity + 1
                     );
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_f0.fodder);
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT71(uStack_367,local_368) + 1);
    }
  } while (KVar1 != end);
  return __return_storage_ptr__;
}

Assistant:

Token parseComprehensionSpecs(Token::Kind end, Fodder for_fodder,
                                  std::vector<ComprehensionSpec> &specs)
    {
        while (true) {
            LocationRange l;
            Token id_token = popExpect(Token::IDENTIFIER);
            const Identifier *id = alloc->makeIdentifier(id_token.data32());
            Token in_token = popExpect(Token::IN);
            AST *arr = parse(MAX_PRECEDENCE);
            specs.emplace_back(
                ComprehensionSpec::FOR, for_fodder, id_token.fodder, id, in_token.fodder, arr);

            Token maybe_if = pop();
            for (; maybe_if.kind == Token::IF; maybe_if = pop()) {
                AST *cond = parse(MAX_PRECEDENCE);
                specs.emplace_back(
                    ComprehensionSpec::IF, maybe_if.fodder, Fodder{}, nullptr, Fodder{}, cond);
            }
            if (maybe_if.kind == end) {
                return maybe_if;
            }
            if (maybe_if.kind != Token::FOR) {
                std::stringstream ss;
                ss << "expected for, if or " << end << " after for clause, got: " << maybe_if;
                throw StaticError(maybe_if.location, ss.str());
            }
            for_fodder = maybe_if.fodder;
        }
    }